

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O1

void RtMidi_gc(RtMidi *midi,lua_State *L)

{
  iterator __position;
  key_type local_20;
  
  local_20.first = midi;
  local_20.second = L;
  __position = std::
               _Rb_tree<std::pair<RtMidi_*,_lua_State_*>,_std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>,_std::_Select1st<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
               ::find((_Rb_tree<std::pair<RtMidi_*,_lua_State_*>,_std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>,_std::_Select1st<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
                       *)(anonymous_namespace)::RtMidi_callbacks,&local_20);
  if (__position._M_node != (_Base_ptr)((anonymous_namespace)::RtMidi_callbacks + 8)) {
    luaL_unref(L,0xffffd8f0,*(undefined4 *)&__position._M_node[1]._M_left);
    std::
    _Rb_tree<std::pair<RtMidi*,lua_State*>,std::pair<std::pair<RtMidi*,lua_State*>const,int>,std::_Select1st<std::pair<std::pair<RtMidi*,lua_State*>const,int>>,std::less<std::pair<RtMidi*,lua_State*>>,std::allocator<std::pair<std::pair<RtMidi*,lua_State*>const,int>>>
    ::erase_abi_cxx11_((_Rb_tree<std::pair<RtMidi*,lua_State*>,std::pair<std::pair<RtMidi*,lua_State*>const,int>,std::_Select1st<std::pair<std::pair<RtMidi*,lua_State*>const,int>>,std::less<std::pair<RtMidi*,lua_State*>>,std::allocator<std::pair<std::pair<RtMidi*,lua_State*>const,int>>>
                        *)(anonymous_namespace)::RtMidi_callbacks,__position);
  }
  return;
}

Assistant:

LUA_RTMIDI_LOCAL void RtMidi_gc(RtMidi &midi, lua_State *L) {
	auto it = RtMidi_callbacks.find({&midi, L});
	if (it != RtMidi_callbacks.end()) {
		luaL_unref(L, LUA_REGISTRYINDEX, it->second);
		RtMidi_callbacks.erase(it);
	}
}